

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_stream.hpp
# Opt level: O1

int __thiscall
Catch::StreamBufImpl<Catch::OutputDebugWriter,_256UL>::overflow
          (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this,int c)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  (**(code **)(*(long *)&this->super_StreamBufBase + 0x30))();
  if (c != -1) {
    puVar1 = *(undefined1 **)&(this->super_StreamBufBase).field_0x30;
    if (*(undefined1 **)&(this->super_StreamBufBase).field_0x20 == puVar1) {
      local_30 = local_20;
      std::__cxx11::string::_M_construct((ulong)&local_30,'\x01');
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_30,local_28);
      if (local_30 != local_20) {
        operator_delete(local_30);
      }
    }
    else {
      puVar2 = *(undefined1 **)&(this->super_StreamBufBase).field_0x28;
      if (puVar2 < puVar1) {
        *puVar2 = (char)c;
        puVar1 = &(this->super_StreamBufBase).field_0x28;
        *(long *)puVar1 = *(long *)puVar1 + 1;
      }
      else {
        (**(code **)(*(long *)&this->super_StreamBufBase + 0x68))(this,c & 0xff);
      }
    }
  }
  return 0;
}

Assistant:

int overflow( int c ) {
            sync();

            if( c != EOF ) {
                if( pbase() == epptr() )
                    m_writer( std::string( 1, static_cast<char>( c ) ) );
                else
                    sputc( static_cast<char>( c ) );
            }
            return 0;
        }